

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

optional<pbrt::CameraWiSample> *
pbrt::detail::
Dispatch<pbrt::Camera::SampleWi(pbrt::Interaction_const&,pbrt::Point2<float>,pbrt::SampledWavelengths&)const::__0&,pstd::optional<pbrt::CameraWiSample>,pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
          (anon_class_24_3_dba100dc *func,void *ptr,int index)

{
  int in_ECX;
  optional<pbrt::CameraWiSample> *in_RDI;
  
  if (in_ECX == 0) {
    const::$_0::operator()((anon_class_24_3_dba100dc *)in_RDI,(PerspectiveCamera *)in_RDI);
  }
  else if (in_ECX == 1) {
    const::$_0::operator()((anon_class_24_3_dba100dc *)in_RDI,(OrthographicCamera *)in_RDI);
  }
  else if (in_ECX == 2) {
    const::$_0::operator()((anon_class_24_3_dba100dc *)in_RDI,(SphericalCamera *)in_RDI);
  }
  else {
    const::$_0::operator()((anon_class_24_3_dba100dc *)in_RDI,(RealisticCamera *)in_RDI);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU R Dispatch(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);
    DCHECK_LT(index, 4);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    default:
        return func((const T3 *)ptr);
    }
}